

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_MatcherFailure_x_iutest_x_Eq_Test::Body(iu_MatcherFailure_x_iutest_x_Eq_Test *this)

{
  TestFlag *pTVar1;
  Variable *pVVar2;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  TestFlag local_424;
  detail *local_420;
  long local_410 [2];
  string local_400;
  AssertionResult local_3e0;
  AssertionResult local_3b8;
  AssertionHelper local_390;
  SPIFailureChecker local_360;
  undefined1 local_328 [8];
  int *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [7];
  ios_base local_2a8 [264];
  undefined1 local_1a0 [32];
  char *local_180;
  undefined8 local_178;
  ios_base local_120 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_360.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_360.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_360.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_424);
  local_320 = (int *)local_1a0;
  local_1a0._0_4_ = 0;
  local_328 = (undefined1  [8])&PTR__IMatcher_0023c380;
  local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::detail::EqMatcher<int>::operator()
            (&local_3b8,(EqMatcher<int> *)local_328,(int *)&local_390);
  if (local_3b8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_328);
    std::ostream::operator<<(local_318,1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base(local_2a8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_400,local_420,"Eq(0)",(char *)&local_3b8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,local_400._M_dataplus._M_p,(allocator<char> *)local_328);
    local_390.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_390.m_part_result.super_iuCodeMessage.m_line = 0x1b1;
    local_390.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_390,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_390.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_390.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if (local_420 != (detail *)local_410) {
      operator_delete(local_420,local_410[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
    operator_delete(local_3b8.m_message._M_dataplus._M_p,
                    local_3b8.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = local_424.m_test_flags;
  local_318[0]._M_allocated_capacity._0_4_ = 0x203a7145;
  local_318[0]._M_allocated_capacity._4_2_ = 0x30;
  local_320 = (int *)0x5;
  local_328 = (undefined1  [8])local_318;
  iutest::detail::SPIFailureChecker::GetResult(&local_3e0,&local_360,(string *)local_328);
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT26(local_318[0]._M_allocated_capacity._6_2_,
                             CONCAT24(local_318[0]._M_allocated_capacity._4_2_,
                                      (undefined4)local_318[0]._M_allocated_capacity)) + 1);
  }
  local_360.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_360.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_360.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar2 = iutest::TestEnv::get_vars();
  pVVar2->m_testpartresult_reporter =
       local_360.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_3e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_328,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_328);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,local_3e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_360);
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_178 = 0x1000001b1;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1a0,(Fixed *)local_328,false);
    if ((undefined1 *)CONCAT44(local_1a0._4_4_,local_1a0._0_4_) != local_1a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1a0._4_4_,local_1a0._0_4_),local_1a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base(local_2a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.m_message._M_dataplus._M_p != &local_3e0.m_message.field_2) {
    operator_delete(local_3e0.m_message._M_dataplus._M_p,
                    local_3e0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, Eq)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(1, Eq(0)), "Eq: 0" );
}